

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::anon_unknown_2::ReservedNamePrefix
                   (string *__return_storage_ptr__,string *classname,FileDescriptor *file)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  string lower;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  pcVar1 = (classname->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + classname->_M_string_length);
  puVar2 = local_50;
  if (local_48 != 0) {
    lVar4 = 0;
    do {
      iVar3 = tolower((int)(char)puVar2[lVar4]);
      puVar2[lVar4] = (char)iVar3;
      lVar4 = lVar4 + 1;
    } while (local_48 != lVar4);
  }
  lVar4 = 0;
  do {
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar3 == 0) {
      iVar3 = std::__cxx11::string::compare(*(char **)(file + 8));
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (iVar3 == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"GPB","");
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"PB","");
      }
      goto LAB_0027a2b8;
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x268);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_0027a2b8:
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ReservedNamePrefix(const std::string& classname,
                                const FileDescriptor* file) {
  bool is_reserved = false;

  std::string lower = classname;
  std::transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      is_reserved = true;
      break;
    }
  }

  if (is_reserved) {
    if (file->package() == "google.protobuf") {
      return "GPB";
    } else {
      return "PB";
    }
  }

  return "";
}